

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall
DataSourceAmiga::make_shadow_from_symbol(DataSourceAmiga *this,PSpriteAmiga *symbol)

{
  _func_int **pp_Var1;
  int iVar2;
  __shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  PSpriteAmiga PVar3;
  int local_64;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar2 = 10;
  local_64 = iVar2;
  std::make_shared<DataSourceAmiga::SpriteAmiga,int,int>((int *)this,&local_64);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<DataSourceAmiga::SpriteAmiga,void>(local_30,in_RDX);
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,local_30,1,0,in_R8,in_R9,iVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<DataSourceAmiga::SpriteAmiga,void>(local_40,in_RDX);
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,local_40,0,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<DataSourceAmiga::SpriteAmiga,void>(local_50,in_RDX);
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,local_50,2,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<DataSourceAmiga::SpriteAmiga,void>(local_60,in_RDX);
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,local_60,1,2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  (**(code **)(*pp_Var1 + 0x50))(pp_Var1,0xffffffffffffffff);
  PVar3.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar3.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar3.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::make_shadow_from_symbol(PSpriteAmiga symbol) {
  PSpriteAmiga res = std::make_shared<SpriteAmiga>(10, 10);
  res->stick(symbol, 1, 0);
  res->stick(symbol, 0, 1);
  res->stick(symbol, 2, 1);
  res->stick(symbol, 1, 2);
  res->fill_masked({0xFF, 0xFF, 0xFF, 0xFF});
  return res;
}